

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

void speech_handler(CHAR_DATA *ch,CHAR_DATA *mob,SPEECH_DATA *speech)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  LINE_DATA *pLVar3;
  CHAR_DATA *pCVar4;
  char *pstr;
  size_t sVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  int iVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  CHAR_DATA *mob_local;
  CHAR_DATA *ch_local;
  SPEECH_DATA *speech_local;
  string local_12d8;
  string local_12b8;
  string buffer;
  string local_1278;
  char *local_1258 [2];
  char *local_1248;
  char buf [4608];
  
  if (speech == (SPEECH_DATA *)0x0) {
    return;
  }
  if (mob == (CHAR_DATA *)0x0 || speech->first_line == (LINE_DATA *)0x0) {
    return;
  }
  if (mob->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (mob->position < 5) {
    return;
  }
  pLVar3 = speech->current_line;
  if (pLVar3 == (LINE_DATA *)0x0) {
    speech->current_line = speech->first_line;
    return;
  }
  iVar7 = 0;
  mob_local = mob;
  ch_local = ch;
  speech_local = speech;
  memset(buf,0,0x1200);
  pstr = palloc_string(pLVar3->text);
  pCVar4 = ch_local;
  pcVar6 = pstr;
  do {
    cVar2 = *pcVar6;
    if (cVar2 == '$') {
      if (pcVar6[1] != 'N') goto LAB_002455f6;
      pcVar6 = pcVar6 + 1;
      strcat(buf,pCVar4->name);
      sVar5 = strlen(pCVar4->name);
      iVar7 = iVar7 + (int)sVar5 + -1;
    }
    else {
      if (cVar2 == '\0') break;
LAB_002455f6:
      buf[iVar7] = cVar2;
    }
    pcVar6 = pcVar6 + 1;
    iVar7 = iVar7 + 1;
  } while( true );
  free_pstring(pstr);
  paVar1 = &buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  buffer._M_dataplus._M_p = (pointer)paVar1;
  switch(pLVar3->type) {
  case 0:
    do_say(mob_local,buf);
    break;
  case 1:
    say_to(mob_local,ch_local,buf,"");
    break;
  case 2:
    local_1258[0] = ch_local->name;
    fmt_00.size_ = 0xcc;
    fmt_00.data_ = (char *)0x5;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1258;
    local_1248 = buf;
    ::fmt::v9::vformat_abi_cxx11_(&local_1278,(v9 *)0x3b0333,fmt_00,args);
    std::__cxx11::string::operator=((string *)&buffer,(string *)&local_1278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
      operator_delete(local_1278._M_dataplus._M_p,local_1278.field_2._M_allocated_capacity + 1);
    }
    do_tell(mob_local,buffer._M_dataplus._M_p);
    break;
  case 3:
    do_whisper(mob_local,buf);
    break;
  case 4:
    do_yell(mob_local,buf);
    break;
  case 5:
    do_emote(mob_local,buf);
    break;
  case 6:
    break;
  case 7:
    do_sing(mob_local,buf);
    break;
  default:
    fmt._M_str = "Error in speech -- missing/invalid type.";
    fmt._M_len = 0x28;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
    goto LAB_0024585d;
  }
  pLVar3 = pLVar3->next;
  if (pLVar3 == (LINE_DATA *)0x0) {
    speech_local->current_line = speech_local->first_line;
  }
  else {
    speech_local->current_line = pLVar3;
    iVar7 = pLVar3->delay;
    if (iVar7 < 1) {
      speech_handler(ch_local,mob_local,speech_local);
    }
    else {
      local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b8,"speech_handler","");
      local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d8,"speech_handler","");
      CQueue::
      AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>
                (&RS.Queue,iVar7,&local_12b8,&local_12d8,speech_handler,&ch_local,&mob_local,
                 &speech_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
        operator_delete(local_12d8._M_dataplus._M_p,local_12d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
        operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0024585d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer._M_dataplus._M_p != paVar1) {
    operator_delete(buffer._M_dataplus._M_p,
                    CONCAT71(buffer.field_2._M_allocated_capacity._1_7_,
                             buffer.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void speech_handler(CHAR_DATA *ch, CHAR_DATA *mob, SPEECH_DATA *speech)
{
	if (!speech || !speech->first_line || !mob || !mob->in_room)
		return;

	if (mob->position < POS_RESTING)
		return;

	auto line = speech->current_line;
	if (line == nullptr)
	{
		speech->current_line = speech->first_line;
		return;
	}

	char buf[MAX_STRING_LENGTH];
	for (auto i = 0; i < MAX_STRING_LENGTH; i++)
	{
		buf[i] = '\0';
	}

	auto copy = palloc_string(line->text);
	auto point = copy;

	for (auto i = 0; *point && *point != '\0'; i++)
	{
		if (*point == '$')
		{
			point++;
			if (*point == 'N')
			{
				strcat(buf, ch->name);
				i += (strlen(ch->name) - 1);
			}
			else
			{
				point--;
				buf[i] = *point;
			}
		}
		else
		{
			buf[i] = *point;
		}
		point++;
	}

	free_pstring(copy);

	std::string buffer; // outside of switch to appease the compiler gods
	switch (line->type)
	{
	case SPEECH_SAY:
		do_say(mob, buf);
		break;
	case SPEECH_SAYTO:
		say_to(mob, ch, buf, "");
		break;
	case SPEECH_TELL:
		buffer = fmt::format("{} {}", ch->name, buf);
		do_tell(mob, buffer.data());
		break;
	case SPEECH_WHISPER:
		do_whisper(mob, buf);
		break;
	case SPEECH_YELL:
		do_yell(mob, buf);
		break;
	case SPEECH_EMOTE:
		do_emote(mob, buf);
		break;
	case SPEECH_ECHO:
		break;
	case SPEECH_SING:
		do_sing(mob, buf);
		break;
	default:
		RS.Logger.Warn("Error in speech -- missing/invalid type.");
		return;
	}

	if (!line->next)
	{
		speech->current_line = speech->first_line;
		return;
	}

	speech->current_line = line->next;

	if (speech->current_line->delay <= 0)
	{
		speech_handler(ch, mob, speech);
		return;
	}

	RS.Queue.AddToQueue(speech->current_line->delay, "speech_handler", "speech_handler", speech_handler, ch, mob, speech);
}